

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O0

void __thiscall
PathTracer::CmdRender(PathTracer *this,shared_ptr<myvk::CommandBuffer> *command_buffer)

{
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  element_type *this_00;
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<myvk::CommandBuffer> *command_buffer_00;
  element_type *memory_barriers;
  long in_RDI;
  float float_push_constants [5];
  uint32_t uint_push_constants [2];
  uint32_t in_stack_fffffffffffffd78;
  uint32_t in_stack_fffffffffffffd7c;
  Camera *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  uint32_t in_stack_fffffffffffffd8c;
  uint32_t in_stack_fffffffffffffd90;
  VkShaderStageFlags in_stack_fffffffffffffd94;
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  *in_stack_fffffffffffffd98;
  CommandBuffer *in_stack_fffffffffffffda0;
  allocator_type *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  iterator in_stack_fffffffffffffdb8;
  _func_int **pp_Var3;
  size_type in_stack_fffffffffffffdc0;
  element_type *image_memory_barriers;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_fffffffffffffdc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  CommandBuffer *this_01;
  element_type **local_1d8;
  Sobol *this_02;
  CommandBuffer local_148;
  undefined8 local_118;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_f8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_f4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_f0;
  float local_ec;
  float local_e8;
  undefined4 local_e0;
  LightTypes local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  allocator<std::shared_ptr<myvk::DescriptorSet>_> local_ad [13];
  Sobol *local_a0;
  undefined1 local_98 [48];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  element_type *local_38;
  undefined8 local_30;
  
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x170df4);
  local_a0 = (Sobol *)local_98;
  this_00 = std::__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Octree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x170e19);
  Octree::GetDescriptorSet(this_00);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_a0 = (Sobol *)(local_98 + 0x10);
  std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x170e69);
  Camera::GetFrameDescriptorSet(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  this_02 = (Sobol *)(local_98 + 0x20);
  local_a0 = this_02;
  peVar1 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x170ebe);
  Lighting::GetEnvironmentMapPtr(peVar1);
  peVar2 = std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x170edd);
  command_buffer_00 = (shared_ptr<myvk::CommandBuffer> *)EnvironmentMap::GetDescriptorSet(peVar2);
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_a0 = (Sobol *)local_68;
  Sobol::GetDescriptorSet((Sobol *)(in_RDI + 0x30));
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_a0 = (Sobol *)local_58;
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_a0 = (Sobol *)local_48;
  std::shared_ptr<myvk::DescriptorSet>::shared_ptr
            ((shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::DescriptorSet> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_38 = (element_type *)local_98;
  local_30 = 6;
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSet>_> *)0x170fc5);
  __l._M_len = in_stack_fffffffffffffdc0;
  __l._M_array = in_stack_fffffffffffffdb8;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),__l,
           in_stack_fffffffffffffda8);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::ComputePipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::ComputePipeline> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x17103c);
  myvk::CommandBuffer::CmdBindDescriptorSets
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x17107d);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::allocator<std::shared_ptr<myvk::DescriptorSet>_>::~allocator(local_ad);
  local_1d8 = &local_38;
  do {
    local_1d8 = local_1d8 + -2;
    std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x1710cc);
  } while (local_1d8 != (element_type **)local_98);
  local_e0 = *(undefined4 *)(in_RDI + 0x1b0);
  std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x17110c);
  local_dc = Lighting::GetFinalLightType((Lighting *)in_stack_fffffffffffffd80);
  peVar1 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x171125);
  local_f8 = (peVar1->m_sun_radiance).field_0;
  peVar1 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x17113d);
  local_f4 = (peVar1->m_sun_radiance).field_1;
  peVar1 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x171155);
  local_f0 = (peVar1->m_sun_radiance).field_2;
  peVar1 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x17116d);
  Lighting::GetEnvironmentMapPtr(peVar1);
  peVar2 = std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x17117d);
  local_ec = peVar2->m_rotation;
  peVar1 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x171194);
  Lighting::GetEnvironmentMapPtr(peVar1);
  peVar2 = std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1711a4);
  local_e8 = peVar2->m_multiplier;
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1711bf);
  myvk::CommandBuffer::CmdPushConstants
            (in_stack_fffffffffffffda0,(Ptr<PipelineLayout> *)in_stack_fffffffffffffd98,
             in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
             in_stack_fffffffffffffd80);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17120f);
  myvk::CommandBuffer::CmdPushConstants
            (in_stack_fffffffffffffda0,(Ptr<PipelineLayout> *)in_stack_fffffffffffffd98,
             in_stack_fffffffffffffd94,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
             in_stack_fffffffffffffd80);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x171248);
  std::shared_ptr<myvk::PipelineBase>::shared_ptr<myvk::ComputePipeline,void>
            ((shared_ptr<myvk::PipelineBase> *)in_stack_fffffffffffffd80,
             (shared_ptr<myvk::ComputePipeline> *)
             CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  myvk::CommandBuffer::CmdBindPipeline
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (Ptr<PipelineBase> *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  std::shared_ptr<myvk::PipelineBase>::~shared_ptr((shared_ptr<myvk::PipelineBase> *)0x171298);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1712a5);
  group_8(*(uint32_t *)(in_RDI + 0x1a8));
  group_8(*(uint32_t *)(in_RDI + 0x1ac));
  myvk::CommandBuffer::CmdDispatch
            ((CommandBuffer *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
             in_stack_fffffffffffffd78,0);
  memory_barriers =
       std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)0x1712fb);
  pp_Var3 = (_func_int **)0x0;
  image_memory_barriers = (element_type *)0x0;
  local_148.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148.m_command_buffer = (VkCommandBuffer)0x0;
  local_118 = 0;
  p_Var4 = &local_148.m_command_pool_ptr.
            super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x17132e);
  local_148.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
  .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = &local_148;
  local_148.super_DeviceObjectBase.super_Base._vptr_Base = pp_Var3;
  local_148.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
  .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = image_memory_barriers;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x171359);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)0x171384);
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_01,(VkPipelineStageFlags)((ulong)p_Var4 >> 0x20),(VkPipelineStageFlags)p_Var4,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)memory_barriers,
             in_stack_fffffffffffffdc8,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             image_memory_barriers);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  Sobol::CmdNext(this_02,command_buffer_00);
  return;
}

Assistant:

void PathTracer::CmdRender(const std::shared_ptr<myvk::CommandBuffer> &command_buffer) {
	command_buffer->CmdBindDescriptorSets({m_octree_ptr->GetDescriptorSet(),
	                                       m_camera_ptr->GetFrameDescriptorSet(kFrameCount),
	                                       m_lighting_ptr->GetEnvironmentMapPtr()->GetDescriptorSet(),
	                                       m_sobol.GetDescriptorSet(), m_target_descriptor_set, m_noise_descriptor_set},
	                                      m_pipeline);

	uint32_t uint_push_constants[] = {m_bounce, (uint32_t)m_lighting_ptr->GetFinalLightType()};
	float float_push_constants[] = {
	    m_lighting_ptr->m_sun_radiance.x, m_lighting_ptr->m_sun_radiance.y, m_lighting_ptr->m_sun_radiance.z,
	    m_lighting_ptr->GetEnvironmentMapPtr()->m_rotation, m_lighting_ptr->GetEnvironmentMapPtr()->m_multiplier};

	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, 0, sizeof(uint_push_constants),
	                                 uint_push_constants);
	command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_COMPUTE_BIT, sizeof(uint_push_constants),
	                                 sizeof(float_push_constants), float_push_constants);
	command_buffer->CmdBindPipeline(m_pipeline);
	command_buffer->CmdDispatch(group_8(m_width), group_8(m_height), 1);

	command_buffer->CmdPipelineBarrier(VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, {},
	                                   {}, {});

	m_sobol.CmdNext(command_buffer);
}